

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void NULLC::ShrinkAutoArray(NULLCAutoArray *arr,uint size)

{
  char *error;
  
  if (arr == (NULLCAutoArray *)0x0) {
    error = "ERROR: null pointer access";
  }
  else {
    if (size <= arr->len) {
      arr->len = size;
      return;
    }
    error = "ERROR: cannot extend array";
  }
  nullcThrowError(error);
  return;
}

Assistant:

void NULLC::ShrinkAutoArray(NULLCAutoArray* arr, unsigned size)
{
	if(!arr)
	{
		nullcThrowError("ERROR: null pointer access");
		return;
	}
	if(size > (unsigned)arr->len)
	{
		nullcThrowError("ERROR: cannot extend array");
		return;
	}
	arr->len = size;
}